

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O1

void __thiscall duckdb::roaring::RoaringCompressState::FlushContainer(RoaringCompressState *this)

{
  atomic<unsigned_long> *paVar1;
  bool bVar2;
  uint16_t uVar3;
  ushort uVar4;
  ushort uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  uint16_t uVar8;
  pointer pCVar9;
  bool bVar10;
  
  uVar3 = (this->container_state).length;
  if (uVar3 != 0) {
    bVar2 = (this->container_state).last_bit_set;
    bVar10 = (bool)(bVar2 ^ 1);
    (*(this->container_state).append_function)(&this->container_state,bVar10,uVar3);
    uVar8 = 0;
    if (bVar2 == false) {
      uVar8 = uVar3;
    }
    (this->container_state).last_is_null = bVar10;
    uVar6 = (this->container_state).appended_count;
    uVar7 = (this->container_state).null_count;
    (this->container_state).appended_count = uVar3 + uVar6;
    (this->container_state).null_count = uVar8 + uVar7;
    (this->container_state).length = 0;
  }
  if ((this->container_state).appended_count != 0) {
    ContainerCompressionState::Finalize(&this->container_state);
    uVar4 = (this->container_state).appended_count;
    this->total_count = this->total_count + (ulong)uVar4;
    uVar5 = (this->container_state).null_count;
    if ((uVar5 != 0) || ((this->container_state).uncompressed != (validity_t *)0x0)) {
      pCVar9 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(&this->current_segment);
      (pCVar9->stats).statistics.has_null = true;
    }
    if ((uVar5 != uVar4) || ((this->container_state).uncompressed != (validity_t *)0x0)) {
      pCVar9 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(&this->current_segment);
      (pCVar9->stats).statistics.has_no_null = true;
    }
    uVar4 = (this->container_state).appended_count;
    pCVar9 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    LOCK();
    paVar1 = &(pCVar9->super_SegmentBase<duckdb::ColumnSegment>).count;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + (ulong)uVar4;
    UNLOCK();
    (this->container_state).length = 0;
    (this->container_state).appended_count = 0;
    (this->container_state).null_count = 0;
    (this->container_state).run_idx = 0;
    (this->container_state).array_idx[0] = 0;
    (this->container_state).array_idx[1] = 0;
    (this->container_state).finalized = false;
    (this->container_state).last_is_null = false;
    (this->container_state).arrays[1] = (this->container_state).base_arrays[1];
    (this->container_state).arrays[0] = (this->container_state).base_arrays[0];
    (this->container_state).runs = (this->container_state).base_runs;
    (this->container_state).compressed_arrays[1] = (this->container_state).base_compressed_arrays[1]
    ;
    (this->container_state).compressed_arrays[0] = (this->container_state).base_compressed_arrays[0]
    ;
    (this->container_state).compressed_runs = (this->container_state).base_compressed_runs;
    (this->container_state).array_counts[1] = (this->container_state).base_array_counts[1];
    (this->container_state).array_counts[0] = (this->container_state).base_array_counts[0];
    (this->container_state).run_counts = (this->container_state).base_run_counts;
    *(uint8_t *)((long)((this->container_state).base_array_counts + 0) + 0) = '\0';
    *(uint8_t *)((long)((this->container_state).base_array_counts + 0) + 1) = '\0';
    *(uint8_t *)((long)((this->container_state).base_array_counts + 0) + 2) = '\0';
    *(uint8_t *)((long)((this->container_state).base_array_counts + 0) + 3) = '\0';
    *(uint8_t *)((long)((this->container_state).base_array_counts + 0) + 4) = '\0';
    *(uint8_t *)((long)((this->container_state).base_array_counts + 0) + 5) = '\0';
    *(uint8_t *)((long)((this->container_state).base_array_counts + 0) + 6) = '\0';
    *(uint8_t *)((long)((this->container_state).base_array_counts + 0) + 7) = '\0';
    *(uint8_t *)((long)((this->container_state).base_array_counts + 1) + 0) = '\0';
    *(uint8_t *)((long)((this->container_state).base_array_counts + 1) + 1) = '\0';
    *(uint8_t *)((long)((this->container_state).base_array_counts + 1) + 2) = '\0';
    *(uint8_t *)((long)((this->container_state).base_array_counts + 1) + 3) = '\0';
    *(uint8_t *)((long)((this->container_state).base_array_counts + 1) + 4) = '\0';
    *(uint8_t *)((long)((this->container_state).base_array_counts + 1) + 5) = '\0';
    *(uint8_t *)((long)((this->container_state).base_array_counts + 1) + 6) = '\0';
    *(uint8_t *)((long)((this->container_state).base_array_counts + 1) + 7) = '\0';
    (this->container_state).base_run_counts[0] = '\0';
    (this->container_state).base_run_counts[1] = '\0';
    (this->container_state).base_run_counts[2] = '\0';
    (this->container_state).base_run_counts[3] = '\0';
    (this->container_state).base_run_counts[4] = '\0';
    (this->container_state).base_run_counts[5] = '\0';
    (this->container_state).base_run_counts[6] = '\0';
    (this->container_state).base_run_counts[7] = '\0';
    (this->container_state).uncompressed = (validity_t *)0x0;
  }
  return;
}

Assistant:

void RoaringCompressState::FlushContainer() {
	if (container_state.length) {
		container_state.Append(!container_state.last_bit_set, container_state.length);
		container_state.length = 0;
	}

	if (!container_state.appended_count) {
		return;
	}
	container_state.Finalize();
#ifdef DEBUG
	auto container_index = GetContainerIndex();
	auto metadata = container_metadata[container_index];

	idx_t container_size = container_state.appended_count;
	if (!metadata.IsUncompressed()) {
		unique_ptr<ContainerScanState> scan_state;
		if (metadata.IsRun()) {
			D_ASSERT(metadata.IsInverted());
			auto number_of_runs = metadata.NumberOfRuns();
			if (number_of_runs >= COMPRESSED_RUN_THRESHOLD) {
				auto segments = container_state.run_counts;
				auto data_ptr = container_state.compressed_runs;
				scan_state = make_uniq<CompressedRunContainerScanState>(container_index, container_size, number_of_runs,
				                                                        segments, data_ptr);
			} else {
				auto data_ptr = reinterpret_cast<data_ptr_t>(container_state.runs);
				scan_state =
				    make_uniq<RunContainerScanState>(container_index, container_size, number_of_runs, data_ptr);
			}
		} else {
			auto cardinality = metadata.Cardinality();
			if (cardinality >= COMPRESSED_ARRAY_THRESHOLD) {
				if (metadata.IsInverted()) {
					auto segments = reinterpret_cast<data_ptr_t>(container_state.array_counts[NULLS]);
					auto data_ptr = reinterpret_cast<data_ptr_t>(container_state.compressed_arrays[NULLS]);
					scan_state = make_uniq<CompressedArrayContainerScanState<NULLS>>(container_index, container_size,
					                                                                 cardinality, segments, data_ptr);
				} else {
					auto segments = reinterpret_cast<data_ptr_t>(container_state.array_counts[NON_NULLS]);
					auto data_ptr = reinterpret_cast<data_ptr_t>(container_state.compressed_arrays[NON_NULLS]);
					scan_state = make_uniq<CompressedArrayContainerScanState<NON_NULLS>>(
					    container_index, container_size, cardinality, segments, data_ptr);
				}
			} else {
				if (metadata.IsInverted()) {
					auto data_ptr = reinterpret_cast<data_ptr_t>(container_state.arrays[NULLS]);
					scan_state = make_uniq<ArrayContainerScanState<NULLS>>(container_index, container_size, cardinality,
					                                                       data_ptr);
				} else {
					auto data_ptr = reinterpret_cast<data_ptr_t>(container_state.arrays[NON_NULLS]);
					scan_state = make_uniq<ArrayContainerScanState<NON_NULLS>>(container_index, container_size,
					                                                           cardinality, data_ptr);
				}
			}
		}
		scan_state->Verify();
	}

#endif
	total_count += container_state.appended_count;
	bool has_nulls = container_state.null_count != 0;
	bool has_non_nulls = container_state.null_count != container_state.appended_count;
	if (has_nulls || container_state.uncompressed) {
		current_segment->stats.statistics.SetHasNullFast();
	}
	if (has_non_nulls || container_state.uncompressed) {
		current_segment->stats.statistics.SetHasNoNullFast();
	}
	current_segment->count += container_state.appended_count;
	container_state.Reset();
}